

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

bool not_empty(v_array<v_array<unsigned_int>_> tournaments)

{
  v_array<unsigned_int> *pvVar1;
  uint *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  uint **ppuVar6;
  ulong uVar7;
  
  lVar4 = (long)tournaments._end - (long)tournaments._begin;
  if (lVar4 != 0) {
    uVar5 = lVar4 >> 5;
    if ((tournaments._begin)->_end == (tournaments._begin)->_begin) {
      ppuVar6 = &tournaments._begin[1]._end;
      uVar3 = 1;
      do {
        uVar7 = uVar3;
        if (uVar5 + (uVar5 == 0) == uVar7) break;
        puVar2 = *ppuVar6;
        pvVar1 = (v_array<unsigned_int> *)(ppuVar6 + -1);
        ppuVar6 = ppuVar6 + 4;
        uVar3 = uVar7 + 1;
      } while (puVar2 == pvVar1->_begin);
      return uVar7 < uVar5;
    }
  }
  return lVar4 != 0;
}

Assistant:

bool not_empty(v_array<v_array<uint32_t>> tournaments)
{
  for (size_t i = 0; i < tournaments.size(); i++)
  {
    if (tournaments[i].size() > 0)
      return true;
  }
  return false;
}